

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_coletree.c
# Opt level: O1

int sp_symetree(int *acolst,int *acolend,int *arow,int n,int *parent)

{
  ulong uVar1;
  int *addr;
  int *addr_00;
  int iVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  
  addr = mxCallocInt(n);
  addr_00 = mxCallocInt(n);
  if (0 < n) {
    uVar3 = 0;
    do {
      iVar2 = (int)uVar3;
      addr_00[uVar3] = iVar2;
      addr[uVar3] = iVar2;
      parent[uVar3] = n;
      lVar4 = (long)acolst[uVar3];
      uVar1 = uVar3;
      if (acolst[uVar3] < acolend[uVar3]) {
        do {
          uVar5 = uVar1 & 0xffffffff;
          lVar8 = (long)arow[lVar4];
          if (lVar8 < (long)uVar3) {
            uVar7 = (ulong)addr_00[lVar8];
            iVar6 = addr_00[uVar7];
            if (iVar6 != addr_00[lVar8]) {
              do {
                addr_00[lVar8] = iVar6;
                lVar8 = (long)iVar6;
                uVar7 = (ulong)addr_00[lVar8];
                iVar6 = addr_00[uVar7];
              } while (iVar6 != addr_00[lVar8]);
            }
            iVar6 = (int)uVar7;
            if (uVar3 != (uint)addr[iVar6]) {
              parent[addr[iVar6]] = iVar2;
              addr_00[(int)uVar1] = iVar6;
              addr[iVar6] = iVar2;
              uVar5 = uVar7;
            }
          }
          lVar4 = lVar4 + 1;
          uVar1 = uVar5;
        } while (lVar4 < acolend[uVar3]);
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 != (uint)n);
  }
  superlu_free(addr);
  superlu_free(addr_00);
  return 0;
}

Assistant:

int sp_symetree(
                const int *acolst, const int *acolend, /* column starts and ends past 1 */
                const int *arow,            /* row indices of A */
                int n,                /* dimension of A */
                int *parent)    /* parent in elim tree */
{
	int	*root;		    /* root of subtree of etree 	*/
	int	rset, cset;             
	int	row, col;
	int	rroot;
	int	p;
	int     *pp;

	root = mxCallocInt (n);
	initialize_disjoint_sets (n, &pp);

	for (col = 0; col < n; col++) {
		cset = make_set (col, pp);
		root[cset] = col;
		parent[col] = n; /* Matlab */
		for (p = acolst[col]; p < acolend[col]; p++) {
			row = arow[p];
			if (row >= col) continue;
			rset = find (row, pp);
			rroot = root[rset];
			if (rroot != col) {
				parent[rroot] = col;
				cset = link (cset, rset, pp);
				root[cset] = col;
			}
		}
	}
	SUPERLU_FREE (root);
	finalize_disjoint_sets (pp);
	return 0;
}